

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O1

void __thiscall
fasttext::NegativeSamplingLoss::NegativeSamplingLoss
          (NegativeSamplingLoss *this,shared_ptr<fasttext::Matrix> *wo,int neg,
          vector<long,_std::allocator<long>_> *targetCounts)

{
  iterator __position;
  pointer piVar1;
  pointer piVar2;
  double dVar3;
  unkuint9 Var4;
  pointer plVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint extraout_XMM0_Dc;
  uint uVar9;
  uint extraout_XMM0_Dd;
  float local_50;
  int local_4c;
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  Loss::Loss((Loss *)this,wo);
  (this->super_BinaryLogisticLoss).super_Loss._vptr_Loss =
       (_func_int **)&PTR__NegativeSamplingLoss_00156968;
  this->neg_ = neg;
  (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->uniform_)._M_param._M_a = 0;
  (this->uniform_)._M_param._M_b = 0xffffffffffffffff;
  plVar5 = (targetCounts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((targetCounts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_finish == plVar5) {
    local_50 = 0.0;
  }
  else {
    local_50 = 0.0;
    uVar7 = 0;
    do {
      dVar3 = (double)plVar5[uVar7];
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      local_50 = (float)((double)local_50 + ABS(dVar3));
      uVar7 = uVar7 + 1;
      plVar5 = (targetCounts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(targetCounts->super__Vector_base<long,_std::allocator<long>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)plVar5 >> 3));
  }
  plVar5 = (targetCounts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((targetCounts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_finish != plVar5) {
    uVar7 = 0;
    do {
      uVar8 = 0;
      uVar9 = 0;
      dVar3 = (double)plVar5[uVar7];
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
        uVar8 = extraout_XMM0_Dc;
        uVar9 = extraout_XMM0_Dd;
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      uStack_44 = (uint)((ulong)dVar3 >> 0x20) & 0x7fffffff;
      uStack_40 = uVar8 & 0x7fffffff;
      uStack_3c = uVar9 & 0x7fffffff;
      local_48 = (ABS((float)dVar3) * 1e+07) / local_50;
      if (0.0 < local_48) {
        uVar6 = 1;
        do {
          local_4c = (int)uVar7;
          __position._M_current =
               (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&this->negatives_,__position,&local_4c);
          }
          else {
            *__position._M_current = local_4c;
            (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          Var4 = (unkuint9)uVar6;
          uVar6 = uVar6 + 1;
        } while ((float)(unkint9)Var4 < local_48);
      }
      uVar7 = uVar7 + 1;
      plVar5 = (targetCounts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(targetCounts->super__Vector_base<long,_std::allocator<long>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)plVar5 >> 3));
  }
  piVar1 = (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar2 = (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->uniform_)._M_param._M_a = 0;
  (this->uniform_)._M_param._M_b = ((long)piVar1 - (long)piVar2 >> 2) - 1;
  return;
}

Assistant:

NegativeSamplingLoss::NegativeSamplingLoss(
    std::shared_ptr<Matrix>& wo,
    int neg,
    const std::vector<int64_t>& targetCounts)
    : BinaryLogisticLoss(wo), neg_(neg), negatives_(), uniform_() {
  real z = 0.0;
  for (size_t i = 0; i < targetCounts.size(); i++) {
    z += pow(targetCounts[i], 0.5);
  }
  for (size_t i = 0; i < targetCounts.size(); i++) {
    real c = pow(targetCounts[i], 0.5);
    for (size_t j = 0; j < c * NegativeSamplingLoss::NEGATIVE_TABLE_SIZE / z;
         j++) {
      negatives_.push_back(i);
    }
  }
  uniform_ = std::uniform_int_distribution<size_t>(0, negatives_.size() - 1);
}